

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O1

Var Js::JavascriptOperators::OP_TypeofPropertyScoped
              (FrameDisplay *pScope,PropertyId propertyId,Var defaultInstance,
              ScriptContext *scriptContext)

{
  ushort uVar1;
  BOOL BVar2;
  RecyclableObject *pRVar3;
  Var pvVar4;
  uint index;
  
  uVar1 = pScope->length;
  if (uVar1 != 0) {
    index = 0;
    do {
      pRVar3 = (RecyclableObject *)FrameDisplay::GetItem(pScope,index);
      BVar2 = HasProperty(pRVar3,propertyId);
      if (BVar2 != 0) {
        pvVar4 = TypeofFld_Internal(pRVar3,false,propertyId,scriptContext);
        return pvVar4;
      }
      index = index + 1;
    } while (uVar1 != index);
  }
  pRVar3 = VarTo<Js::RecyclableObject>(defaultInstance);
  pvVar4 = TypeofFld_Internal(pRVar3,true,propertyId,scriptContext);
  return pvVar4;
}

Assistant:

Var JavascriptOperators::OP_TypeofPropertyScoped(FrameDisplay *pScope, PropertyId propertyId, Var defaultInstance, ScriptContext* scriptContext)
    {
        JIT_HELPER_REENTRANT_HEADER(Op_TypeofPropertyScoped);
        int i;
        int length = pScope->GetLength();

        for (i = 0; i < length; i++)
        {
            DynamicObject *obj = (DynamicObject*)pScope->GetItem(i);
            if (JavascriptOperators::HasProperty(obj, propertyId))
            {
                return JavascriptOperators::TypeofFld(obj, propertyId, scriptContext);
            }
        }

        return JavascriptOperators::TypeofRootFld(VarTo<RecyclableObject>(defaultInstance), propertyId, scriptContext);
        JIT_HELPER_END(Op_TypeofPropertyScoped);
    }